

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O1

Int32 testing::internal::Int32FromGTestEnv(char *flag,Int32 default_value)

{
  Int32 IVar1;
  char *pcVar2;
  bool bVar3;
  char *str;
  long lVar4;
  ostream *poVar5;
  ostream *this;
  String SVar6;
  Int32 result;
  String env_var;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  Int32 local_5c;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58 [2];
  Int32 local_44;
  char *local_40;
  long local_38;
  
  FlagToEnvVar((internal *)&local_40,flag);
  str = getenv(local_40);
  if (str != (char *)0x0) {
    local_5c = default_value;
    local_44 = default_value;
    Message::Message((Message *)local_58);
    poVar5 = (ostream *)(local_58[0].ptr_ + 0x10);
    if (local_58[0].ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar5 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Environment variable ",0x15);
    pcVar2 = local_40;
    poVar5 = (ostream *)(local_58[0].ptr_ + 0x10);
    if (local_58[0].ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar5 = (ostream *)0x0;
    }
    if (local_40 == (char *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(null)",6);
    }
    else if (local_38 != 0) {
      lVar4 = 0;
      do {
        if (pcVar2[lVar4] == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\\0",2);
        }
        else {
          local_68.ptr_._0_1_ = pcVar2[lVar4];
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_68,1);
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != local_38);
    }
    bVar3 = ParseInt32((Message *)local_58,str,&local_5c);
    if (local_58[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_58[0].ptr_ + 8))();
      local_58[0].ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    IVar1 = local_44;
    default_value = local_5c;
    if (!bVar3) {
      Message::Message((Message *)&local_68);
      this = (ostream *)(local_68.ptr_ + 0x10);
      if (local_68.ptr_ == (stringstream *)0x0) {
        this = (ostream *)0x0;
      }
      std::ostream::operator<<(this,IVar1);
      SVar6 = StringStreamToString((internal *)local_58,local_68.ptr_);
      printf("The default value %s is used.\n",local_58[0].ptr_,SVar6.length_);
      if (local_58[0].ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete__(local_58[0].ptr_);
      }
      if (local_68.ptr_ != (stringstream *)0x0) {
        (**(code **)(*(long *)local_68.ptr_ + 8))();
        local_68.ptr_ = (stringstream *)0x0;
      }
      fflush(_stdout);
      default_value = IVar1;
    }
  }
  if (local_40 != (char *)0x0) {
    operator_delete__(local_40);
  }
  return default_value;
}

Assistant:

Int32 Int32FromGTestEnv(const char* flag, Int32 default_value) {
  const String env_var = FlagToEnvVar(flag);
  const char* const string_value = posix::GetEnv(env_var.c_str());
  if (string_value == NULL) {
    // The environment variable is not set.
    return default_value;
  }

  Int32 result = default_value;
  if (!ParseInt32(Message() << "Environment variable " << env_var,
                  string_value, &result)) {
    printf("The default value %s is used.\n",
           (Message() << default_value).GetString().c_str());
    fflush(stdout);
    return default_value;
  }

  return result;
}